

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O0

string * Vault::Base64::decode(string *__return_storage_ptr__,string *encoded_string)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  int iVar5;
  bool local_81;
  char local_63 [7];
  int iStack_5c;
  uchar char_array_3 [3];
  uchar char_array_4 [4];
  int in_;
  int j;
  int i;
  int in_len;
  allocator<char> local_39;
  string local_38 [8];
  string base64_chars;
  string *encoded_string_local;
  string *ret;
  
  base64_chars.field_2._8_8_ = encoded_string;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",&local_39);
  std::allocator<char>::~allocator(&local_39);
  j = std::__cxx11::string::size();
  in_ = 0;
  iStack_5c = 0;
  memset(local_63 + 3,0,4);
  memset(local_63,0,3);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    iVar2 = j + -1;
    local_81 = false;
    if (j != 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[](base64_chars.field_2._8_8_);
      local_81 = false;
      if (*pcVar3 != '=') {
        puVar4 = (uchar *)std::__cxx11::string::operator[](base64_chars.field_2._8_8_);
        local_81 = is_base64(*puVar4);
      }
    }
    if (local_81 == false) break;
    pcVar3 = (char *)std::__cxx11::string::operator[](base64_chars.field_2._8_8_);
    iVar5 = in_ + 1;
    local_63[(long)in_ + 3] = *pcVar3;
    iStack_5c = iStack_5c + 1;
    in_ = iVar5;
    j = iVar2;
    if (iVar5 == 4) {
      for (in_ = 0; in_ < 4; in_ = in_ + 1) {
        cVar1 = std::__cxx11::string::find((char)local_38,(ulong)(uint)(int)local_63[(long)in_ + 3])
        ;
        local_63[(long)in_ + 3] = cVar1;
      }
      local_63[0] = local_63[3] * '\x04' + (char)((int)((byte)local_63[4] & 0x30) >> 4);
      local_63[1] = local_63[4] * '\x10' + (char)((int)((byte)local_63[5] & 0x3c) >> 2);
      local_63[2] = local_63[5] * '@' + local_63[6];
      for (in_ = 0; in_ < 3; in_ = in_ + 1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_63[in_]);
      }
      in_ = 0;
    }
  }
  if (in_ != 0) {
    char_array_4[0] = (undefined1)in_;
    char_array_4[1] = in_._1_1_;
    char_array_4[2] = in_._2_1_;
    char_array_4[3] = in_._3_1_;
    for (; (int)char_array_4 < 4; char_array_4 = (uchar  [4])((int)char_array_4 + 1)) {
      local_63[(long)(int)char_array_4 + 3] = '\0';
    }
    char_array_4[0] = '\0';
    char_array_4[1] = '\0';
    char_array_4[2] = '\0';
    char_array_4[3] = '\0';
    for (; (int)char_array_4 < 4; char_array_4 = (uchar  [4])((int)char_array_4 + 1)) {
      cVar1 = std::__cxx11::string::find
                        ((char)local_38,(ulong)(uint)(int)local_63[(long)(int)char_array_4 + 3]);
      local_63[(long)(int)char_array_4 + 3] = cVar1;
    }
    local_63[0] = local_63[3] * '\x04' + (char)((int)((byte)local_63[4] & 0x30) >> 4);
    local_63[1] = local_63[4] * '\x10' + (char)((int)((byte)local_63[5] & 0x3c) >> 2);
    local_63[2] = local_63[5] * '@' + local_63[6];
    char_array_4[0] = '\0';
    char_array_4[1] = '\0';
    char_array_4[2] = '\0';
    char_array_4[3] = '\0';
    for (; (int)char_array_4 < in_ + -1; char_array_4 = (uchar  [4])((int)char_array_4 + 1)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_63[(int)char_array_4])
      ;
    }
  }
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Vault::Base64::decode(std::string const &encoded_string) {
  std::string base64_chars =
      "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
  int in_len = encoded_string.size();
  int i = 0;
  int j = 0;
  int in_ = 0;
  unsigned char char_array_4[4] = {0};
  unsigned char char_array_3[3] = {0};
  std::string ret;

  while (in_len-- && (encoded_string[in_] != '=') &&
         is_base64(encoded_string[in_])) {
    char_array_4[i++] = encoded_string[in_];
    in_++;
    if (i == 4) {
      for (i = 0; i < 4; i++) {
        char_array_4[i] = base64_chars.find(char_array_4[i]);
      }

      char_array_3[0] =
          (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
      char_array_3[1] =
          ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
      char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

      for (i = 0; (i < 3); i++) {
        ret += char_array_3[i];
      }

      i = 0;
    }
  }

  if (i) {
    for (j = i; j < 4; j++) {
      char_array_4[j] = 0;
    }

    for (j = 0; j < 4; j++) {
      char_array_4[j] = base64_chars.find(char_array_4[j]);
    }

    char_array_3[0] = (char_array_4[0] << 2) + ((char_array_4[1] & 0x30) >> 4);
    char_array_3[1] =
        ((char_array_4[1] & 0xf) << 4) + ((char_array_4[2] & 0x3c) >> 2);
    char_array_3[2] = ((char_array_4[2] & 0x3) << 6) + char_array_4[3];

    for (j = 0; (j < i - 1); j++) {
      ret += char_array_3[j];
    }
  }

  return ret;
}